

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool pugi::impl::anon_unknown_0::has_declaration(xml_node_struct *node)

{
  uint uVar1;
  xml_node_struct *pxStack_20;
  xml_node_type type;
  xml_node_struct *child;
  xml_node_struct *node_local;
  
  pxStack_20 = node->first_child;
  while( true ) {
    if (pxStack_20 == (xml_node_struct *)0x0) {
      return false;
    }
    uVar1 = (uint)pxStack_20->header & 0xf;
    if (uVar1 == 7) break;
    if (uVar1 == 2) {
      return false;
    }
    pxStack_20 = pxStack_20->next_sibling;
  }
  return true;
}

Assistant:

PUGI__FN bool has_declaration(xml_node_struct* node)
	{
		for (xml_node_struct* child = node->first_child; child; child = child->next_sibling)
		{
			xml_node_type type = PUGI__NODETYPE(child);

			if (type == node_declaration) return true;
			if (type == node_element) return false;
		}

		return false;
	}